

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O3

void __thiscall ThreadPool::~ThreadPool(ThreadPool *this)

{
  pointer ptVar1;
  thread *worker;
  pointer ptVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  this->_vptr_ThreadPool = (_func_int **)&PTR__ThreadPool_001daf30;
  local_30._M_device = &this->_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  this->_stop = true;
  std::unique_lock<std::mutex>::unlock(&local_30);
  std::condition_variable::notify_all();
  ptVar1 = (this->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar2 = (this->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    std::thread::join();
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            (&(this->_tasks).c);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->_threads);
  std::condition_variable::~condition_variable(&this->_cond);
  return;
}

Assistant:

inline ThreadPool::~ThreadPool()
{
    std::unique_lock<std::mutex> lock(_mutex);
    _stop = true;
    lock.unlock();

    _cond.notify_all();

    for (auto& worker : _threads)
        worker.join();
}